

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

void __thiscall
rapidxml::xml_document<char>::parse_node_attributes<0>
          (xml_document<char> *this,char **text,xml_node<char> *node)

{
  char cVar1;
  uchar uVar2;
  parse_error *ppVar3;
  xml_attribute<char> *attribute_00;
  char *pcVar4;
  size_t sVar5;
  char *pcStack_58;
  int AttFlags;
  char *end;
  char *value;
  char quote;
  xml_attribute<char> *attribute;
  char *name;
  xml_node<char> *node_local;
  char **text_local;
  xml_document<char> *this_local;
  
  while( true ) {
    uVar2 = attribute_name_pred::test(**text);
    if (uVar2 == '\0') {
      return;
    }
    pcVar4 = *text;
    *text = *text + 1;
    skip<rapidxml::xml_document<char>::attribute_name_pred,0>(text);
    if (*text == pcVar4) {
      ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(ppVar3,"expected attribute name",pcVar4);
      __cxa_throw(ppVar3,&parse_error::typeinfo,parse_error::~parse_error);
    }
    attribute_00 = memory_pool<char>::allocate_attribute
                             (&this->super_memory_pool<char>,(char *)0x0,(char *)0x0,0,0);
    xml_base<char>::name(&attribute_00->super_xml_base<char>,pcVar4,(long)*text - (long)pcVar4);
    xml_node<char>::append_attribute(node,attribute_00);
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
    if (**text != '=') {
      ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(ppVar3,"expected =",*text);
      __cxa_throw(ppVar3,&parse_error::typeinfo,parse_error::~parse_error);
    }
    *text = *text + 1;
    pcVar4 = xml_base<char>::name(&attribute_00->super_xml_base<char>);
    sVar5 = xml_base<char>::name_size(&attribute_00->super_xml_base<char>);
    pcVar4[sVar5] = '\0';
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
    cVar1 = **text;
    if ((cVar1 != '\'') && (cVar1 != '\"')) break;
    *text = *text + 1;
    pcVar4 = *text;
    if (cVar1 == '\'') {
      pcStack_58 = skip_and_expand_character_refs<rapidxml::xml_document<char>::attribute_value_pred<(char)39>,rapidxml::xml_document<char>::attribute_value_pure_pred<(char)39>,0>
                             (text);
    }
    else {
      pcStack_58 = skip_and_expand_character_refs<rapidxml::xml_document<char>::attribute_value_pred<(char)34>,rapidxml::xml_document<char>::attribute_value_pure_pred<(char)34>,0>
                             (text);
    }
    xml_base<char>::value
              (&attribute_00->super_xml_base<char>,pcVar4,(long)pcStack_58 - (long)pcVar4);
    if (**text != cVar1) {
      ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(ppVar3,"expected \' or \"",*text);
      __cxa_throw(ppVar3,&parse_error::typeinfo,parse_error::~parse_error);
    }
    *text = *text + 1;
    pcVar4 = xml_base<char>::value(&attribute_00->super_xml_base<char>);
    sVar5 = xml_base<char>::value_size(&attribute_00->super_xml_base<char>);
    pcVar4[sVar5] = '\0';
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
  }
  ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
  parse_error::parse_error(ppVar3,"expected \' or \"",*text);
  __cxa_throw(ppVar3,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

void parse_node_attributes(Ch *&text, xml_node<Ch> *node)
        {
            // For all attributes 
            while (attribute_name_pred::test(*text))
            {
                // Extract attribute name
                Ch *name = text;
                ++text;     // Skip first character of attribute name
                skip<attribute_name_pred, Flags>(text);
                if (text == name)
                    RAPIDXML_PARSE_ERROR("expected attribute name", name);

                // Create new attribute
                xml_attribute<Ch> *attribute = this->allocate_attribute();
                attribute->name(name, text - name);
                node->append_attribute(attribute);

                // Skip whitespace after attribute name
                skip<whitespace_pred, Flags>(text);

                // Skip =
                if (*text != Ch('='))
                    RAPIDXML_PARSE_ERROR("expected =", text);
                ++text;

                // Add terminating zero after name
                if (!(Flags & parse_no_string_terminators))
                    attribute->name()[attribute->name_size()] = 0;

                // Skip whitespace after =
                skip<whitespace_pred, Flags>(text);

                // Skip quote and remember if it was ' or "
                Ch quote = *text;
                if (quote != Ch('\'') && quote != Ch('"'))
                    RAPIDXML_PARSE_ERROR("expected ' or \"", text);
                ++text;

                // Extract attribute value and expand char refs in it
                Ch *value = text, *end;
                const int AttFlags = Flags & ~parse_normalize_whitespace;   // No whitespace normalization in attributes
                if (quote == Ch('\''))
                    end = skip_and_expand_character_refs<attribute_value_pred<Ch('\'')>, attribute_value_pure_pred<Ch('\'')>, AttFlags>(text);
                else
                    end = skip_and_expand_character_refs<attribute_value_pred<Ch('"')>, attribute_value_pure_pred<Ch('"')>, AttFlags>(text);
                
                // Set attribute value
                attribute->value(value, end - value);
                
                // Make sure that end quote is present
                if (*text != quote)
                    RAPIDXML_PARSE_ERROR("expected ' or \"", text);
                ++text;     // Skip quote

                // Add terminating zero after value
                if (!(Flags & parse_no_string_terminators))
                    attribute->value()[attribute->value_size()] = 0;

                // Skip whitespace after attribute value
                skip<whitespace_pred, Flags>(text);
            }
        }